

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext *ctx,ExprFunctionDefinition *node)

{
  SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U> *this;
  FunctionData *pFVar1;
  LLVMValueRefOpaque *pLVar2;
  VariableHandle *pVVar3;
  VariableData *pVVar4;
  ScopeData *pSVar5;
  ExprBase *expression;
  TypeBase *type;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *this_00;
  LLVMValueRefOpaque **ppLVar6;
  VariableData **ppVVar7;
  IntrusiveList<VariableHandle> *pIVar8;
  uint uVar9;
  LLVMValueRef pLVar10;
  IntrusiveList<ExprBase> *pIVar11;
  LLVMValueRef storage;
  LLVMValueRefOpaque *local_58;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> *local_50;
  LLVMValueRef local_48;
  FunctionData *pFStack_40;
  
  ppLVar6 = SmallArray<LLVMValueRefOpaque_*,_128U>::operator[]
                      (&ctx->functions,node->function->functionIndex);
  pFVar1 = node->function;
  if (ctx->skipFunctionDefinitions == true) {
    SmallArray<LLVMValueRefOpaque_*,_128U>::operator[](&ctx->functions,pFVar1->functionIndex);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
    CompileLlvmType(ctx,(node->super_ExprBase).type);
    pLVar10 = (LLVMValueRef)&placeholderValue;
    CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  }
  else {
    if (pFVar1->isPrototype == false) {
      pLVar2 = *ppLVar6;
      ctx->skipFunctionDefinitions = true;
      local_48 = ctx->currentFunction;
      pFStack_40 = ctx->currentFunctionSource;
      ctx->currentFunction = pLVar2;
      ctx->currentFunctionSource = pFVar1;
      if (ctx->currentNextRestoreBlock != 0) {
        __assert_fail("ctx.currentNextRestoreBlock == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x6a9,
                      "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                     );
      }
      if ((ctx->currentRestoreBlocks).count != 0) {
        __assert_fail("ctx.currentRestoreBlocks.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x6aa,
                      "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                     );
      }
      local_50 = &ctx->currentRestoreBlocks;
      this = &ctx->variables;
      pIVar8 = &pFVar1->argumentVariables;
      while (pVVar3 = pIVar8->head, pVVar3 != (VariableHandle *)0x0) {
        pVVar4 = pVVar3->variable;
        CompileLlvmType(ctx,pVVar4->type);
        CreateLlvmName(ctx,pVVar4->name->name);
        local_58 = (LLVMValueRefOpaque *)&placeholderValue;
        ppLVar6 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  ::find(this,&pVVar4->uniqueId);
        if (ppLVar6 != (LLVMValueRefOpaque **)0x0) {
          __assert_fail("!ctx.variables.find(variable->uniqueId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x6ca,
                        "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                       );
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (this,&pVVar4->uniqueId,&local_58);
        pIVar8 = (IntrusiveList<VariableHandle> *)&pVVar3->next;
      }
      pVVar4 = node->function->contextArgument;
      if (pVVar4 != (VariableData *)0x0) {
        CompileLlvmType(ctx,pVVar4->type);
        CreateLlvmName(ctx,pVVar4->name->name);
        local_58 = (LLVMValueRefOpaque *)&placeholderValue;
        CompileLlvmType(ctx,node->function->contextType);
        ppLVar6 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                  ::find(this,&pVVar4->uniqueId);
        if (ppLVar6 != (LLVMValueRefOpaque **)0x0) {
          __assert_fail("!ctx.variables.find(variable->uniqueId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x6da,
                        "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                       );
        }
        SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (this,&pVVar4->uniqueId,&local_58);
      }
      uVar9 = 0;
      while( true ) {
        this_00 = local_50;
        pSVar5 = node->function->functionScope;
        if ((pSVar5->allVariables).count <= uVar9) break;
        ppVVar7 = SmallArray<VariableData_*,_4U>::operator[](&pSVar5->allVariables,uVar9);
        pVVar4 = *ppVVar7;
        pIVar8 = &node->function->argumentVariables;
        do {
          pVVar3 = pIVar8->head;
          if (pVVar3 == (VariableHandle *)0x0) {
            if (pVVar4 != node->function->contextArgument) {
              CompileLlvmType(ctx,pVVar4->type);
              CreateLlvmName(ctx,pVVar4->name->name);
              local_58 = (LLVMValueRefOpaque *)&placeholderValue;
              ppLVar6 = SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
                        ::find(this,&pVVar4->uniqueId);
              if (ppLVar6 != (LLVMValueRefOpaque **)0x0) {
                __assert_fail("!ctx.variables.find(variable->uniqueId)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                              ,0x6f4,
                              "LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &, ExprFunctionDefinition *)"
                             );
              }
              SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::
              insert(this,&pVVar4->uniqueId,&local_58);
            }
            break;
          }
          pIVar8 = (IntrusiveList<VariableHandle> *)&pVVar3->next;
        } while (pVVar4 != pVVar3->variable);
        uVar9 = uVar9 + 1;
      }
      if (node->function->coroutine != false) {
        CompileLlvm(ctx,node->coroutineStateRead);
        for (uVar9 = 0; uVar9 < node->function->yieldCount; uVar9 = uVar9 + 1) {
          local_58 = (LLVMValueRefOpaque *)&placeholderBasicBlock;
          CompileLlvmType(ctx,ctx->ctx->typeInt);
          SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::push_back
                    (this_00,(LLVMBasicBlockRefOpaque **)&local_58);
        }
      }
      pIVar11 = &node->expressions;
      while (expression = pIVar11->head, expression != (ExprBase *)0x0) {
        CompileLlvm(ctx,expression);
        pIVar11 = (IntrusiveList<ExprBase> *)&expression->next;
      }
      type = node->function->type->returnType;
      if (type != ctx->ctx->typeVoid) {
        CompileLlvmType(ctx,type);
      }
      ctx->currentFunction = local_48;
      ctx->currentFunctionSource = pFStack_40;
      ctx->currentNextRestoreBlock = 0;
      (ctx->currentRestoreBlocks).count = 0;
      ctx->skipFunctionDefinitions = false;
    }
    pLVar10 = (LLVMValueRef)0x0;
  }
  return pLVar10;
}

Assistant:

LLVMValueRef CompileLlvmFunctionDefinition(LlvmCompilationContext &ctx, ExprFunctionDefinition *node)
{
	LLVMValueRef function = ctx.functions[node->function->functionIndex];

	if(ctx.skipFunctionDefinitions)
	{
		LLVMValueRef function = LLVMBuildPointerCast(ctx.builder, ctx.functions[node->function->functionIndex], CompileLlvmType(ctx, ctx.ctx.typeNullPtr), "func_ptr");

		LLVMValueRef constants[] = { LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)), LLVMConstPointerNull(CompileLlvmType(ctx, ctx.ctx.typeNullPtr)) };

		LLVMValueRef result = LLVMConstNamedStruct(CompileLlvmType(ctx, node->type), constants, 2);

		result = LLVMBuildInsertValue(ctx.builder, result, function, 1, "");

		return CheckType(ctx, node, result);
	}

	if(node->function->isPrototype)
		return NULL;

	ctx.skipFunctionDefinitions = true;

	// Store state
	LLVMValueRef currentFunction = ctx.currentFunction;
	FunctionData *currentFunctionSource = ctx.currentFunctionSource;

	// Switch to new function
	ctx.currentFunction = function;
	ctx.currentFunctionSource = node->function;

	assert(ctx.currentNextRestoreBlock == 0);
	assert(ctx.currentRestoreBlocks.empty());

	LLVMBasicBlockRef block = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	// Allocate all arguments
	unsigned argIndex = 0;

	if(IsStructReturnType(node->function->type->returnType))
		argIndex++;

	for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
	{
		VariableData *variable = curr->variable;

		if(IsStructArgumentType(variable->type))
		{
			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, argument);
		}
		else
		{
			LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

			LLVMValueRef argument = LLVMGetParam(function, argIndex++);

			LLVMBuildStore(ctx.builder, argument, storage);

			assert(!ctx.variables.find(variable->uniqueId));

			ctx.variables.insert(variable->uniqueId, storage);
		}
	}

	if(VariableData *variable = node->function->contextArgument)
	{
		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		LLVMValueRef argument = LLVMGetParam(function, argIndex++);

		argument = LLVMBuildPointerCast(ctx.builder, argument, CompileLlvmType(ctx, node->function->contextType), "context_reinterpret");

		LLVMBuildStore(ctx.builder, argument, storage);

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	// Generate variables for all locals
	for(unsigned i = 0; i < node->function->functionScope->allVariables.size(); i++)
	{
		VariableData *variable = node->function->functionScope->allVariables[i];

		bool isArgument = false;

		for(VariableHandle *curr = node->function->argumentVariables.head; curr; curr = curr->next)
		{
			if(variable == curr->variable)
			{
				isArgument = true;
				break;
			}
		}

		if(isArgument || variable == node->function->contextArgument)
			continue;

		LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, variable->type), CreateLlvmName(ctx, variable->name->name));

		assert(!ctx.variables.find(variable->uniqueId));

		ctx.variables.insert(variable->uniqueId, storage);
	}

	if(node->function->coroutine)
	{
		LLVMValueRef state = CompileLlvm(ctx, node->coroutineStateRead);

		LLVMBasicBlockRef startBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "start");

		LLVMValueRef switchInst = LLVMBuildSwitch(ctx.builder, state, startBlock, node->function->yieldCount);

		LLVMPositionBuilderAtEnd(ctx.builder, startBlock);

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			LLVMBasicBlockRef restoreBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "restore");

			LLVMAddCase(switchInst, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), i + 1, true), restoreBlock);

			ctx.currentRestoreBlocks.push_back(restoreBlock);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmAbortNoReturn"), NULL, 0, "");

	if(node->function->type->returnType == ctx.ctx.typeVoid || IsStructReturnType(node->function->type->returnType))
		LLVMBuildRetVoid(ctx.builder);
	else
		LLVMBuildRet(ctx.builder, LLVMConstNull(CompileLlvmType(ctx, node->function->type->returnType)));

	CheckFunction(ctx, ctx.currentFunction, node->function->name->name);

	if(LLVMRunFunctionPassManager(ctx.functionPassManager, function))
		LLVMRunFunctionPassManager(ctx.functionPassManager, function);

	// Restore state
	ctx.currentFunction = currentFunction;
	ctx.currentFunctionSource = currentFunctionSource;

	ctx.currentNextRestoreBlock = 0;
	ctx.currentRestoreBlocks.clear();

	ctx.skipFunctionDefinitions = false;

	return NULL;
}